

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

boolean option_value_ok(nh_option_desc *option,nh_optvalue value)

{
  boolean bVar1;
  int iVar2;
  size_t sVar3;
  int local_24;
  int i;
  nh_option_desc *option_local;
  nh_optvalue value_local;
  
  option_local._0_4_ = value.i;
  switch(option->type) {
  case OPTTYPE_BOOL:
    option_local._0_1_ = value.b;
    if ((int)(char)option_local == (uint)((char)option_local != '\0')) {
      return '\x01';
    }
    break;
  case OPTTYPE_INT:
    if (((option->field_4).i.min <= (int)option_local) &&
       ((int)option_local <= (option->field_4).i.max)) {
      return '\x01';
    }
    break;
  case OPTTYPE_ENUM:
    for (local_24 = 0; local_24 < (option->field_4).e.numchoices; local_24 = local_24 + 1) {
      if ((int)option_local == (option->field_4).e.choices[local_24].id) {
        return '\x01';
      }
    }
    break;
  case OPTTYPE_STRING:
    if (((value.s != (char *)0x0) &&
        (sVar3 = strlen(value.s), sVar3 <= (ulong)(long)(option->field_4).i.max)) &&
       ((*value.s == '\0' ||
        ((iVar2 = strcmp("spellorder",option->name), iVar2 != 0 ||
         (bVar1 = change_spell_order(value.s,'\x01'), bVar1 != '\0')))))) {
      return '\x01';
    }
    break;
  case OPTTYPE_AUTOPICKUP_RULES:
    if ((value.s == (char *)0x0) || ((value.ar)->num_rules < 0x3e9)) {
      return '\x01';
    }
    break;
  case OPTTYPE_MSGTYPE:
    if ((value.s == (char *)0x0) || ((value.ar)->num_rules < 0x3e9)) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static boolean option_value_ok(struct nh_option_desc *option,
			       union nh_optvalue value)
{
	int i;
	
	switch (option->type) {
	    case OPTTYPE_BOOL:
		if (value.b == !!value.b)
		    return TRUE;
		break;
		
	    case OPTTYPE_INT:
		if (value.i >= option->i.min && value.i <= option->i.max)
		    return TRUE;
		break;
		
	    case OPTTYPE_ENUM:
		for (i = 0; i < option->e.numchoices; i++)
		    if (value.e == option->e.choices[i].id)
			return TRUE;
		break;
		
	    case OPTTYPE_STRING:
		if (!value.s)
		    break;
		
		if (strlen(value.s) > option->s.maxlen)
		    break;
		
		if (!*value.s)
		    value.s = NULL;
		else {
		    if (!strcmp("spellorder", option->name)) {
			if (!change_spell_order(value.s, TRUE))
			    break;
		    }
		}
		
		return TRUE;
		
	    case OPTTYPE_AUTOPICKUP_RULES:
		if (value.ar && value.ar->num_rules > AUTOPICKUP_MAX_RULES)
		    break;
		return TRUE;
		
	    case OPTTYPE_MSGTYPE:
		if (value.mt && value.mt->num_rules > MSGTYPE_MAX_RULES)
		    break;
		return TRUE;
	}
	
	return FALSE;
}